

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

bool __thiscall
QComboMenuDelegate::editorEvent
          (QComboMenuDelegate *this,QEvent *event,QAbstractItemModel *model,
          QStyleOptionViewItem *option,QModelIndex *index)

{
  ushort uVar1;
  undefined1 uVar2;
  int iVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QVariant QStack_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (**(code **)(*(long *)model + 0x138))(model,index);
  uVar2 = 0;
  if ((((uVar4 & 0x10) == 0) || ((uVar4 & 0x20) == 0)) ||
     (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 1) == 0)) goto LAB_003ad7c4;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QVariant *)&local_58,index,10);
  if (puStack_40 < (undefined1 *)0x4) {
LAB_003ad7b8:
    uVar2 = 0;
  }
  else {
    uVar1 = *(ushort *)(event + 8);
    if (uVar1 - 3 < 2) {
      if (*(int *)(event + 0x40) == 1) {
        if (uVar1 == 4) goto LAB_003ad7b2;
        if (index->r == this->pressedIndex) {
          this->pressedIndex = -1;
          goto LAB_003ad767;
        }
      }
      goto LAB_003ad7b8;
    }
    if (uVar1 == 2) {
      if (*(int *)(event + 0x40) == 1) {
LAB_003ad7b2:
        this->pressedIndex = index->r;
      }
      goto LAB_003ad7b8;
    }
    if ((uVar1 != 6) || ((*(int *)(event + 0x40) != 0x1010000 && (*(int *)(event + 0x40) != 0x20))))
    goto LAB_003ad7b8;
LAB_003ad767:
    iVar3 = ::QVariant::toInt((bool *)local_58.data);
    ::QVariant::QVariant(&QStack_78,(uint)(iVar3 != 2) * 2);
    uVar2 = (**(code **)(*(long *)model + 0x98))(model,index,&QStack_78,10);
    ::QVariant::~QVariant(&QStack_78);
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
LAB_003ad7c4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar2;
}

Assistant:

bool QComboMenuDelegate::editorEvent(QEvent *event, QAbstractItemModel *model,
                                     const QStyleOptionViewItem &option, const QModelIndex &index)
{
    Q_ASSERT(event);
    Q_ASSERT(model);

    // make sure that the item is checkable
    Qt::ItemFlags flags = model->flags(index);
    if (!(flags & Qt::ItemIsUserCheckable) || !(option.state & QStyle::State_Enabled)
        || !(flags & Qt::ItemIsEnabled))
        return false;

    // make sure that we have a check state
    const QVariant checkState = index.data(Qt::CheckStateRole);
    if (!checkState.isValid())
        return false;

    // make sure that we have the right event type
    if ((event->type() == QEvent::MouseButtonRelease)
        || (event->type() == QEvent::MouseButtonDblClick)
        || (event->type() == QEvent::MouseButtonPress)) {
        QMouseEvent *me = static_cast<QMouseEvent*>(event);
        if (me->button() != Qt::LeftButton)
            return false;

        if ((event->type() == QEvent::MouseButtonPress)
            || (event->type() == QEvent::MouseButtonDblClick)) {
            pressedIndex = index.row();
            return false;
        }

        if (index.row() != pressedIndex)
            return false;
        pressedIndex = -1;

    } else if (event->type() == QEvent::KeyPress) {
        if (static_cast<QKeyEvent*>(event)->key() != Qt::Key_Space
         && static_cast<QKeyEvent*>(event)->key() != Qt::Key_Select)
            return false;
    } else {
        return false;
    }

    // we don't support user-tristate items in QComboBox (not implemented in any style)
    Qt::CheckState newState = (static_cast<Qt::CheckState>(checkState.toInt()) == Qt::Checked)
                            ? Qt::Unchecked : Qt::Checked;
    return model->setData(index, newState, Qt::CheckStateRole);
}